

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaSAXUnplug(xmlSchemaSAXPlugPtr plug)

{
  xmlSAXHandlerPtr pxVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((plug != (xmlSchemaSAXPlugPtr)0x0) && (iVar2 = -1, plug->magic == 0xdc43ba21)) {
    plug->magic = 0;
    xmlSchemaPostRun(plug->ctxt);
    pxVar1 = plug->user_sax;
    *plug->user_sax_ptr = pxVar1;
    if (pxVar1 != (xmlSAXHandlerPtr)0x0) {
      *plug->user_data_ptr = plug->user_data;
    }
    (*xmlFree)(plug);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
xmlSchemaSAXUnplug(xmlSchemaSAXPlugPtr plug)
{
    xmlSAXHandlerPtr *sax;
    void **user_data;

    if ((plug == NULL) || (plug->magic != XML_SAX_PLUG_MAGIC))
        return(-1);
    plug->magic = 0;

    xmlSchemaPostRun(plug->ctxt);
    /* restore the data */
    sax = plug->user_sax_ptr;
    *sax = plug->user_sax;
    if (plug->user_sax != NULL) {
	user_data = plug->user_data_ptr;
	*user_data = plug->user_data;
    }

    /* free and return */
    xmlFree(plug);
    return(0);
}